

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O1

void asm_href(ASMState *as,IRIns *ir,IROp merge)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  IRIns *pIVar4;
  MCode *pMVar5;
  MCode *pMVar6;
  uint64_t uVar7;
  byte bVar8;
  char cVar9;
  byte bVar10;
  char cVar11;
  byte bVar12;
  uint32_t uVar13;
  byte bVar14;
  byte bVar15;
  Reg r;
  Reg rb;
  uint uVar16;
  Reg rr;
  Reg RVar17;
  ulong uVar18;
  MCode *pMVar19;
  MCode *p_1;
  RegSet allow;
  Reg rr_00;
  ulong uVar20;
  x86Op xVar21;
  long lVar22;
  MCode MVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  int32_t iVar28;
  uint uVar29;
  MCode *p;
  bool bVar30;
  ulong local_58;
  
  bVar30 = true;
  if ((char)(ir->field_1).r < '\0') {
    bVar30 = (ir->field_1).s != '\0';
  }
  r = ra_dest(as,ir,0xbfef);
  uVar24 = ~(1 << (r & 0x1f)) & 0xbfef;
  bVar15 = *(byte *)((long)as->ir + (ulong)(ir->field_0).op1 * 8 + 6);
  rb = (Reg)bVar15;
  if ((char)bVar15 < '\0') {
    rb = ra_allocref(as,(uint)(ir->field_0).op1,uVar24);
  }
  bVar15 = (byte)rb & 0x1f;
  uVar16 = -2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15;
  as->weakset = as->weakset & uVar16;
  pIVar4 = as->ir;
  uVar2 = (ir->field_0).op2;
  uVar20 = (ulong)uVar2;
  bVar15 = *(byte *)((long)pIVar4 + uVar20 * 8 + 4);
  local_58 = 0x80;
  rr = 0x80;
  if ((short)uVar2 < 0) {
    uVar24 = uVar24 & uVar16;
    bVar1 = *(byte *)((long)pIVar4 + uVar20 * 8 + 6);
    rr = (Reg)bVar1;
    if ((char)bVar1 < '\0') {
      allow = 0xffff0000;
      if ((bVar15 & 0x1f) != 0xe) {
        allow = uVar24;
      }
      rr = ra_allocref(as,(uint)uVar2,allow);
    }
    bVar1 = (byte)rr & 0x1f;
    as->weakset = as->weakset & (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
    RVar17 = ra_scratch(as,uVar24 & ~(1 << (rr & 0x1f)));
    local_58 = (ulong)RVar17;
  }
  pMVar19 = as->mcp;
  if (merge == IR_NE) {
    asm_guardcc(as,4);
  }
  else if (bVar30) {
    emit_loadu64(as,r,(uint64_t)(as->J[-1].penalty + 0x34));
  }
  pMVar5 = as->mcp;
  pMVar5[-2] = 'u';
  pMVar5[-1] = '\0';
  as->mcp = pMVar5 + -2;
  RVar17 = r | 0x80200;
  cVar11 = (char)r;
  bVar10 = (byte)(r & 7);
  pMVar5[-3] = bVar10 + cVar11 * '\b' | 0xc0;
  pMVar5[-4] = 0x85;
  bVar8 = (byte)(RVar17 >> 1) & 4;
  uVar24 = r >> 3 & 1;
  bVar1 = (byte)uVar24;
  pMVar5[-5] = bVar1 + bVar8 | 0x48;
  as->mcp = pMVar5 + -5;
  emit_rmro(as,XO_MOV,RVar17,r,0x10);
  pMVar6 = as->mcp;
  cVar9 = (char)pMVar6;
  if (merge == IR_EQ) {
    asm_guardcc(as,4);
  }
  else {
    pMVar6[-1] = (char)pMVar19 - cVar9;
    pMVar6[-2] = 't';
    as->mcp = pMVar6 + -2;
  }
  uVar26 = bVar15 & 0x1f;
  uVar16 = (uint)local_58;
  if (uVar26 == 0xe) {
    if ((short)uVar2 < 0) {
      pMVar19 = as->mcp;
      pMVar19[-1] = cVar9 - (char)pMVar19;
      pMVar19[-2] = 'z';
      as->mcp = pMVar19 + -2;
      emit_rmro(as,XO_UCOMISD,rr,r,8);
      pMVar19 = as->mcp;
      pMVar19[-1] = cVar9 - (char)pMVar19;
      pMVar19[-2] = 's';
      as->mcp = pMVar19 + -3;
      pMVar19[-3] = 0xf2;
      xVar21 = XO_ARITHi8;
    }
    else {
      iVar3 = pIVar4[uVar20 + 1].i;
      if ((char)(MCode)iVar3 == iVar3) {
        pMVar19 = as->mcp;
        as->mcp = pMVar19 + -1;
        pMVar19[-1] = (MCode)iVar3;
        xVar21 = XO_ARITHi8;
      }
      else {
        pMVar19 = as->mcp;
        *(int *)(pMVar19 + -4) = iVar3;
        as->mcp = pMVar19 + -4;
        xVar21 = XO_ARITHi;
      }
      emit_rmro(as,xVar21,7,r,8);
      pMVar19 = as->mcp;
      pMVar19[-1] = cVar9 - (char)pMVar19;
      pMVar19[-2] = 'u';
      as->mcp = pMVar19 + -2;
      iVar3 = *(int *)((long)pIVar4 + uVar20 * 8 + 0xc);
      if ((char)(MCode)iVar3 == iVar3) {
        as->mcp = pMVar19 + -3;
        pMVar19[-3] = (MCode)iVar3;
        xVar21 = XO_ARITHi8;
      }
      else {
        *(int *)(pMVar19 + -6) = iVar3;
        as->mcp = pMVar19 + -6;
        xVar21 = XO_ARITHi;
      }
    }
LAB_001420af:
    rr_00 = 7;
    iVar28 = 0xc;
  }
  else {
    if (9 < uVar26 - 3) {
      pMVar19 = as->mcp;
      *(uint *)(pMVar19 + -4) = ~uVar26 << 0xf | 0x7fff;
      as->mcp = pMVar19 + -4;
      xVar21 = XO_ARITHi;
      goto LAB_001420af;
    }
    if (-1 < (short)uVar2) {
      uVar7 = pIVar4[uVar20 + 1].gcr.gcptr64;
      uVar27 = (uint)((ulong)((long)(char)(~*(byte *)((long)pIVar4 + uVar20 * 8 + 4) | 0xe0) << 0x2f
                             ) >> 0x20) | (uint)(uVar7 >> 0x20);
      if ((int)(char)(MCode)uVar7 == (int)uVar7) {
        pMVar19 = as->mcp;
        as->mcp = pMVar19 + -1;
        pMVar19[-1] = (MCode)uVar7;
        xVar21 = XO_ARITHi8;
      }
      else {
        pMVar19 = as->mcp;
        *(int *)(pMVar19 + -4) = (int)uVar7;
        as->mcp = pMVar19 + -4;
        xVar21 = XO_ARITHi;
      }
      emit_rmro(as,xVar21,7,r,8);
      pMVar19 = as->mcp;
      pMVar19[-1] = cVar9 - (char)pMVar19;
      pMVar19[-2] = 'u';
      as->mcp = pMVar19 + -2;
      MVar23 = (MCode)(uVar7 >> 0x20);
      if ((int)(char)MVar23 == uVar27) {
        as->mcp = pMVar19 + -3;
        pMVar19[-3] = MVar23;
        xVar21 = XO_ARITHi8;
      }
      else {
        *(uint *)(pMVar19 + -6) = uVar27;
        as->mcp = pMVar19 + -6;
        xVar21 = XO_ARITHi;
      }
      goto LAB_001420af;
    }
    rr_00 = uVar16 | 0x80200;
    xVar21 = XO_CMP;
    iVar28 = 8;
  }
  emit_rmro(as,xVar21,rr_00,r,iVar28);
  pMVar5[-1] = (char)*(undefined4 *)&as->mcp - (char)pMVar5;
  pMVar19 = as->mcp;
  if (pMVar19 < as->mclim) goto LAB_00142764;
  bVar15 = (byte)local_58;
  if (((short)uVar2 < 0) && (uVar26 - 3 < 10)) {
    pMVar19[-1] = ((byte)rr & 7) + bVar15 * '\b' | 0xc0;
    pMVar19[-2] = '\v';
    pMVar19[-3] = (byte)(rr >> 3) & 1 | (byte)(local_58 >> 1) & 4 | 0x48;
    as->mcp = pMVar19 + -3;
    emit_loadu64(as,uVar16,(ulong)~uVar26 << 0x2f);
  }
  if ((short)uVar2 < 0) {
    iVar28 = 1;
  }
  else {
    uVar27 = *(byte *)((long)pIVar4 + uVar20 * 8 + 4) & 0x1f;
    if (uVar27 == 0xe) {
      uVar18 = (ulong)pIVar4[uVar20 + 1].field_1.op12;
      uVar27 = *(int *)((long)pIVar4 + uVar20 * 8 + 0xc) * 2;
LAB_001421ae:
      uVar25 = ((uint)uVar18 ^ uVar27) - (uVar27 << 0xe | uVar27 >> 0x12);
      iVar28 = ((uVar27 << 0x13 | uVar27 >> 0xd) ^ uVar25) - (uVar25 * 0x2000 | uVar25 >> 0x13);
    }
    else if (uVar27 == 4) {
      iVar28 = *(int32_t *)((long)pIVar4[uVar20 + 1] + 0xc);
    }
    else {
      if (2 < (byte)uVar27) {
        uVar18 = pIVar4[uVar20 + 1].gcr.gcptr64;
        uVar27 = ~uVar27 << 0xf | (uint)(uVar18 >> 0x20);
        goto LAB_001421ae;
      }
      iVar28 = uVar27 - 1;
    }
  }
  if (iVar28 == 0) {
    iVar28 = 0x28;
  }
  else {
    emit_rmro(as,0x30000fe,RVar17,rb,0x28);
    pMVar19 = as->mcp;
    as->mcp = pMVar19 + -1;
    pMVar19[-1] = '\x03';
    pMVar19 = as->mcp;
    pMVar19[-1] = bVar10 - 0x20;
    pMVar19[-2] = 0xc1;
    if ((r & 8) == 0) {
      pMVar19 = pMVar19 + -2;
    }
    else {
      pMVar19[-3] = 'A';
      pMVar19 = pMVar19 + -3;
    }
    as->mcp = pMVar19;
    bVar14 = 0;
    if ((r & 7) == 5) {
      pMVar19[-1] = '\0';
      pMVar19 = pMVar19 + -1;
      bVar14 = 0x40;
    }
    bVar12 = cVar11 * '\b';
    pMVar19[-1] = bVar10 + (bVar12 & 0x38) | 0x40;
    pMVar19[-2] = bVar12 & 0x38 | bVar14 | 4;
    pMVar19[-3] = 0x8d;
    uVar29 = r >> 1 & 4;
    uVar25 = uVar24 + uVar29;
    uVar27 = r >> 2 & 2 | uVar25;
    if (uVar27 == 0) {
      pMVar19 = pMVar19 + -3;
    }
    else {
      pMVar19[-4] = (byte)uVar27 | 0x40;
      pMVar19 = pMVar19 + -4;
    }
    as->mcp = pMVar19;
    if ((short)uVar2 < 0) {
      if ((char)uVar26 != '\x04') {
        emit_rmro(as,0x230000fe,r,rb,0x34);
        pMVar19 = as->mcp;
        bVar14 = bVar15 & 7 | bVar12 | 0xc0;
        pMVar19[-1] = bVar14;
        pMVar19[-2] = '+';
        uVar27 = uVar16 >> 3 & 1;
        uVar29 = uVar29 | uVar27;
        if (uVar29 == 0) {
          lVar22 = -2;
        }
        else {
          pMVar19[-3] = (byte)uVar29 | 0x40;
          lVar22 = -3;
        }
        as->mcp = pMVar19 + lVar22 + -1;
        pMVar19[lVar22 + -1] = '\r';
        pMVar19 = as->mcp;
        pMVar19[-1] = bVar15 & 7 | 0xc0;
        pMVar19[-2] = 0xc1;
        if (uVar27 == 0) {
          pMVar19 = pMVar19 + -2;
        }
        else {
          pMVar19[-3] = 'A';
          pMVar19 = pMVar19 + -3;
        }
        as->mcp = pMVar19;
        pMVar19[-1] = bVar14;
        pMVar19[-2] = '3';
        if (uVar29 == 0) {
          lVar22 = -2;
        }
        else {
          pMVar19[-3] = (byte)uVar29 | 0x40;
          lVar22 = -3;
        }
        as->mcp = pMVar19 + lVar22 + -1;
        pMVar19[lVar22 + -1] = '\x05';
        pMVar19 = as->mcp;
        pMVar19[-1] = bVar10 - 0x40;
        pMVar19[-2] = 0xc1;
        if ((r & 8) == 0) {
          pMVar19 = pMVar19 + -2;
        }
        else {
          pMVar19[-3] = 'A';
          pMVar19 = pMVar19 + -3;
        }
        as->mcp = pMVar19;
        bVar15 = bVar10 + bVar15 * '\b' | 0xc0;
        pMVar19[-1] = bVar15;
        pMVar19[-2] = '+';
        uVar27 = (uint)(local_58 >> 1) & 4;
        uVar24 = uVar27 | uVar24;
        bVar14 = (byte)uVar24;
        if (uVar24 == 0) {
          lVar22 = -2;
        }
        else {
          pMVar19[-3] = bVar14 | 0x40;
          lVar22 = -3;
        }
        as->mcp = pMVar19 + lVar22 + -1;
        pMVar19[lVar22 + -1] = '\x0e';
        pMVar19 = as->mcp;
        pMVar19[-1] = bVar10 - 0x40;
        pMVar19[-2] = 0xc1;
        if ((r & 8) == 0) {
          pMVar19 = pMVar19 + -2;
        }
        else {
          pMVar19[-3] = 'A';
          pMVar19 = pMVar19 + -3;
        }
        as->mcp = pMVar19;
        pMVar19[-1] = bVar15;
        pMVar19[-2] = '3';
        if (uVar24 == 0) {
          pMVar19 = pMVar19 + -2;
        }
        else {
          pMVar19[-3] = bVar14 | 0x40;
          pMVar19 = pMVar19 + -3;
        }
        as->mcp = pMVar19;
        if ((char)uVar26 == '\x0e') {
          pMVar19[-1] = bVar12 | bVar10 | 0xc0;
          pMVar19[-2] = '\x03';
          if (uVar25 == 0) {
            lVar22 = -2;
          }
          else {
            pMVar19[-3] = (byte)uVar25 | 0x40;
            lVar22 = -3;
          }
          as->mcp = pMVar19 + lVar22 + -1;
          pMVar19[lVar22 + -1] = ' ';
          pMVar19 = as->mcp;
          pMVar19[-1] = bVar10 | 0xe8;
          pMVar19[-2] = 0xc1;
          pMVar19[-3] = bVar1 | 0x48;
          as->mcp = pMVar19 + -3;
          pMVar19[-4] = bVar15;
          pMVar19[-5] = 0x8b;
          if (uVar24 == 0) {
            pMVar19 = pMVar19 + -5;
          }
          else {
            pMVar19[-6] = bVar14 | 0x40;
            pMVar19 = pMVar19 + -6;
          }
          as->mcp = pMVar19;
          emit_rr(as,XO_MOVDto,rr | 0x80200,r);
          return;
        }
        bVar15 = (byte)rr & 7;
        pMVar19[-1] = (byte)(uVar16 << 3) | bVar15 | 0xc0;
        pMVar19[-2] = 0x8b;
        uVar24 = rr >> 3 & 1;
        uVar27 = uVar27 | uVar24;
        if (uVar27 == 0) {
          pMVar19 = pMVar19 + -2;
        }
        else {
          pMVar19[-3] = (byte)uVar27 | 0x40;
          pMVar19 = pMVar19 + -3;
        }
        as->mcp = pMVar19;
        if (as->mclim <= pMVar19) {
          emit_gri(as,0x838106,r,~uVar26 << 0xf);
          pMVar19 = as->mcp;
          uVar13 = as->flags;
          as->mcp = pMVar19 + -1;
          pMVar19[-1] = ' ';
          if ((uVar13 & 0x40) != 0) {
            emit_mrm(as,0xf0fbe3c4,r,rr);
            return;
          }
          pMVar19 = as->mcp;
          pMVar19[-1] = bVar10 | 0xe8;
          pMVar19[-2] = 0xc1;
          pMVar19[-3] = bVar1 | 0x48;
          as->mcp = pMVar19 + -3;
          pMVar19[-4] = bVar15 | cVar11 * '\b' | 0xc0;
          pMVar19[-5] = 0x8b;
          pMVar19[-6] = (byte)uVar24 | bVar8 | 0x48;
          as->mcp = pMVar19 + -6;
          return;
        }
LAB_00142764:
        asm_mclimit(as);
      }
      emit_rmro(as,0x230000fe,r,rr,0xc);
    }
    else {
      emit_gri(as,0x838104,r,iVar28);
    }
    iVar28 = 0x34;
    RVar17 = r;
  }
  emit_rmro(as,XO_MOV,RVar17,rb,iVar28);
  return;
}

Assistant:

static void asm_href(ASMState *as, IRIns *ir, IROp merge)
{
  RegSet allow = RSET_GPR;
  int destused = ra_used(ir);
  Reg dest = ra_dest(as, ir, allow);
  Reg tab = ra_alloc1(as, ir->op1, rset_clear(allow, dest));
  Reg key = RID_NONE, tmp = RID_NONE;
  IRIns *irkey = IR(ir->op2);
  int isk = irref_isk(ir->op2);
  IRType1 kt = irkey->t;
  uint32_t khash;
  MCLabel l_end, l_loop, l_next;

  if (!isk) {
    rset_clear(allow, tab);
    key = ra_alloc1(as, ir->op2, irt_isnum(kt) ? RSET_FPR : allow);
    if (LJ_GC64 || !irt_isstr(kt))
      tmp = ra_scratch(as, rset_exclude(allow, key));
  }

  /* Key not found in chain: jump to exit (if merged) or load niltv. */
  l_end = emit_label(as);
  if (merge == IR_NE)
    asm_guardcc(as, CC_E);  /* XI_JMP is not found by lj_asm_patchexit. */
  else if (destused)
    emit_loada(as, dest, niltvg(J2G(as->J)));

  /* Follow hash chain until the end. */
  l_loop = emit_sjcc_label(as, CC_NZ);
  emit_rr(as, XO_TEST, dest|REX_GC64, dest);
  emit_rmro(as, XO_MOV, dest|REX_GC64, dest, offsetof(Node, next));
  l_next = emit_label(as);

  /* Type and value comparison. */
  if (merge == IR_EQ)
    asm_guardcc(as, CC_E);
  else
    emit_sjcc(as, CC_E, l_end);
  if (irt_isnum(kt)) {
    if (isk) {
      /* Assumes -0.0 is already canonicalized to +0.0. */
      emit_gmroi(as, XG_ARITHi(XOg_CMP), dest, offsetof(Node, key.u32.lo),
		 (int32_t)ir_knum(irkey)->u32.lo);
      emit_sjcc(as, CC_NE, l_next);
      emit_gmroi(as, XG_ARITHi(XOg_CMP), dest, offsetof(Node, key.u32.hi),
		 (int32_t)ir_knum(irkey)->u32.hi);
    } else {
      emit_sjcc(as, CC_P, l_next);
      emit_rmro(as, XO_UCOMISD, key, dest, offsetof(Node, key.n));
      emit_sjcc(as, CC_AE, l_next);
      /* The type check avoids NaN penalties and complaints from Valgrind. */
#if LJ_64 && !LJ_GC64
      emit_u32(as, LJ_TISNUM);
      emit_rmro(as, XO_ARITHi, XOg_CMP, dest, offsetof(Node, key.it));
#else
      emit_i8(as, LJ_TISNUM);
      emit_rmro(as, XO_ARITHi8, XOg_CMP, dest, offsetof(Node, key.it));
#endif
    }
#if LJ_64 && !LJ_GC64
  } else if (irt_islightud(kt)) {
    emit_rmro(as, XO_CMP, key|REX_64, dest, offsetof(Node, key.u64));
#endif
#if LJ_GC64
  } else if (irt_isaddr(kt)) {
    if (isk) {
      TValue k;
      k.u64 = ((uint64_t)irt_toitype(irkey->t) << 47) | irkey[1].tv.u64;
      emit_gmroi(as, XG_ARITHi(XOg_CMP), dest, offsetof(Node, key.u32.lo),
		 k.u32.lo);
      emit_sjcc(as, CC_NE, l_next);
      emit_gmroi(as, XG_ARITHi(XOg_CMP), dest, offsetof(Node, key.u32.hi),
		 k.u32.hi);
    } else {
      emit_rmro(as, XO_CMP, tmp|REX_64, dest, offsetof(Node, key.u64));
    }
  } else {
    lj_assertA(irt_ispri(kt) && !irt_isnil(kt), "bad HREF key type");
    emit_u32(as, (irt_toitype(kt)<<15)|0x7fff);
    emit_rmro(as, XO_ARITHi, XOg_CMP, dest, offsetof(Node, key.it));
#else
  } else {
    if (!irt_ispri(kt)) {
      lj_assertA(irt_isaddr(kt), "bad HREF key type");
      if (isk)
	emit_gmroi(as, XG_ARITHi(XOg_CMP), dest, offsetof(Node, key.gcr),
		   ptr2addr(ir_kgc(irkey)));
      else
	emit_rmro(as, XO_CMP, key, dest, offsetof(Node, key.gcr));
      emit_sjcc(as, CC_NE, l_next);
    }
    lj_assertA(!irt_isnil(kt), "bad HREF key type");
    emit_i8(as, irt_toitype(kt));
    emit_rmro(as, XO_ARITHi8, XOg_CMP, dest, offsetof(Node, key.it));
#endif
  }